

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int file_walk_cb(char *fpath,stat *sb,int typeflag,FTW *ftwbuf)

{
  Hash *__dest;
  PerfProfBatch *pPVar1;
  AppCtx *ctx;
  int iVar2;
  char *__s1;
  uint8_t seedidx;
  byte bVar3;
  int32_t *piVar4;
  byte bVar5;
  Instance instance;
  Hash local_11b9;
  PerfProfInput input;
  
  ctx = G_app_ctx_ptr;
  if ((typeflag & 0xfffffffbU) == 0) {
    __s1 = os_get_fext(fpath);
    if (__s1 != (char *)0x0) {
      iVar2 = strcmp(__s1,"vrp");
      if (iVar2 == 0) {
        parse(&instance,fpath);
        if ((((instance.num_customers < 1) || (instance.num_vehicles < 1)) ||
            (instance.vehicle_cap <= 0.0)) || (instance.demands == (double *)0x0)) {
          log_log(0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/main.c"
                  ,0x1b3,"%s: Failed to parse input file\n",fpath);
          exit(1);
        }
        pPVar1 = ctx->current_batch;
        if (((instance.num_customers < (pPVar1->filter).ncustomers.a) ||
            ((pPVar1->filter).ncustomers.b < instance.num_customers)) ||
           ((instance.num_vehicles < (pPVar1->filter).nvehicles.a ||
            ((pPVar1->filter).nvehicles.b < instance.num_vehicles)))) {
          printf("%s: Skipping since it does not match filter\n",fpath);
        }
        else {
          bVar3 = 0;
          memset(&input,0,0x1148);
          strncpy_safe(input.filepath,fpath,0x1000);
          strncpy_safe(input.instance_name,instance.name,0x100);
          __dest = &input.uid.hash;
          hash_instance(&local_11b9,&instance);
          memcpy(__dest,&local_11b9,0x41);
          printf("--- instance_hash :: computed_hash = %s\n",__dest);
          iVar2 = ctx->current_batch->nseeds;
          bVar5 = 100;
          if (iVar2 < 100) {
            bVar5 = (byte)iVar2;
          }
          piVar4 = RANDOM_SEEDS;
          while ((bVar3 < bVar5 && (ctx->should_terminate != true))) {
            input.seed = *piVar4;
            input.uid.seedidx = bVar3;
            handle_vrp_instance(ctx,&input);
            bVar3 = bVar3 + 1;
            piVar4 = piVar4 + 1;
          }
        }
        instance_destroy(&instance);
      }
    }
  }
  else if (typeflag == 1) {
    printf("Found dir: %s\n",fpath);
  }
  return (int)ctx->should_terminate;
}

Assistant:

int file_walk_cb(const char *fpath, const struct stat *sb, int typeflag,
                 struct FTW *ftwbuf) {
    UNUSED_PARAM(sb);
    UNUSED_PARAM(ftwbuf);

    AppCtx *ctx = G_app_ctx_ptr;

    if (typeflag == FTW_F || typeflag == FTW_SL) {
        // Is a regular file
        const char *ext = os_get_fext(fpath);
        if (ext && (0 == strcmp(ext, "vrp"))) {
            // printf("Found file: %s\n", fpath);

            Instance instance = parse(fpath);
            if (is_valid_instance(&instance)) {
                Filter *filter = &ctx->current_batch->filter;
                if (!is_filtered_instance(filter, &instance)) {

                    PerfProfInput input = {0};
                    strncpy_safe(input.filepath, fpath,
                                 ARRAY_LEN(input.filepath));

                    strncpy_safe(input.instance_name, instance.name,
                                 ARRAY_LEN(input.instance_name));

                    input.uid.hash = hash_instance(&instance);

                    printf("--- instance_hash :: computed_hash = %s\n",
                           input.uid.hash.cstr);

                    const uint8_t num_seeds = (uint8_t)(MIN(
                        UINT8_MAX, MIN(ctx->current_batch->nseeds,
                                       ARRAY_LEN_i32(RANDOM_SEEDS))));

                    for (uint8_t seedidx = 0;
                         seedidx < num_seeds && !ctx->should_terminate;
                         seedidx++) {
                        input.uid.seedidx = seedidx;

                        input.seed = RANDOM_SEEDS[seedidx];
                        handle_vrp_instance(ctx, &input);
                    }
                } else {
                    printf("%s: Skipping since it does not match filter\n",
                           fpath);
                }
                instance_destroy(&instance);
            } else {
                log_fatal("%s: Failed to parse input file\n", fpath);
                exit(EXIT_FAILURE);
            }
        }
    } else if (typeflag == FTW_D) {
        printf("Found dir: %s\n", fpath);
    }

    return ctx->should_terminate ? FTW_STOP : FTW_CONTINUE;
}